

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kws_search.c
# Opt level: O3

ps_seg_t * kws_seg_next(ps_seg_t *seg)

{
  int iVar1;
  _func_void_ps_seg_t_ptr *p_Var2;
  undefined8 uVar3;
  int iVar4;
  kws_seg_t *itor;
  
  iVar1 = *(int *)&seg[1].text;
  iVar4 = iVar1 + 1;
  *(int *)&seg[1].text = iVar4;
  if (iVar4 == *(int *)((long)&seg[1].search + 4)) {
    ckd_free(seg[1].vt);
    ckd_free(seg);
    seg = (ps_seg_t *)0x0;
  }
  else {
    p_Var2 = (&(seg[1].vt)->seg_free)[iVar1];
    seg->text = *(char **)p_Var2;
    seg->wid = -1;
    uVar3 = *(undefined8 *)(p_Var2 + 8);
    seg->sf = (int)uVar3;
    seg->ef = (int)((ulong)uVar3 >> 0x20);
    seg->prob = *(int32 *)(p_Var2 + 0x10);
    seg->ascr = *(int32 *)(p_Var2 + 0x14);
    seg->lscr = 0;
  }
  return seg;
}

Assistant:

static ps_seg_t *
kws_seg_next(ps_seg_t *seg)
{
    kws_seg_t *itor = (kws_seg_t *)seg;

    if (++itor->pos == itor->n_detections) {
        kws_seg_free(seg);
        return NULL;
    }

    kws_seg_fill(itor);

    return seg;
}